

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<double>::Decompose_LDLt(TPZMatrix<double> *this)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double val;
  double local_70;
  ulong local_60;
  double local_58;
  ulong local_50;
  double local_48;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < (int)(uint)lVar5) {
    uVar6 = (ulong)((uint)lVar5 & 0x7fffffff);
    local_60 = 1;
    uVar3 = 0;
    do {
      if (uVar3 == 0) {
        local_70 = 0.0;
      }
      else {
        local_70 = 0.0;
        uVar4 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
          local_70 = local_70 + extraout_XMM0_Qa_01 * extraout_XMM0_Qa_00 * extraout_XMM0_Qa;
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
      local_58 = extraout_XMM0_Qa_02 - local_70;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar3,uVar3,&local_58);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
      local_48 = extraout_XMM0_Qa_03;
      if (ABS(extraout_XMM0_Qa_03) < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_50 = uVar3 + 1;
      uVar4 = local_60;
      if (local_50 < uVar6) {
        do {
          if (uVar3 == 0) {
            local_70 = 0.0;
          }
          else {
            local_70 = 0.0;
            uVar2 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar2,uVar2);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar3,uVar2);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar4,uVar2);
              local_70 = local_70 + extraout_XMM0_Qa_06 * extraout_XMM0_Qa_05 * extraout_XMM0_Qa_04;
              uVar2 = uVar2 + 1;
            } while (uVar3 != uVar2);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
          local_58 = (extraout_XMM0_Qa_07 - local_70) / local_48;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar4,uVar3,&local_58);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar3,uVar4,&local_58);
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar6);
      }
      local_60 = local_60 + 1;
      uVar3 = local_50;
    } while (local_50 != uVar6);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}